

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O2

tchar_t Base64Char(wchar_t Value)

{
  char cVar1;
  
  cVar1 = (char)Value;
  if (Value < L'\x1a') {
    return cVar1 + 'A';
  }
  if ((uint)Value < 0x34) {
    return cVar1 + 'G';
  }
  if ((uint)Value < 0x3e) {
    return cVar1 + -4;
  }
  return (Value != L'>') << 2 | 0x2b;
}

Assistant:

static tchar_t Base64Char(int Value)
{
    if (Value < 26)
        return (tchar_t)(Value + 'A');
    if (Value < 52)
        return (tchar_t)(Value - 26 + 'a');
    if (Value < 62)
        return (tchar_t)(Value - 52 + '0');
    if (Value == 62)
        return '+';
    assert(Value == 63);
    return '/';
}